

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawThings(void)

{
  AInventory *key;
  spriteframe_t *psVar1;
  double y;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  AActor *pAVar7;
  FTexture *tex;
  ulong uVar8;
  spriteframe_t *unaff_RBP;
  uint uVar9;
  AActor **ppAVar10;
  double dVar11;
  double dVar12;
  AMColor color;
  double local_98;
  double dStack_90;
  long local_88;
  DAngle local_80;
  DAngle local_78;
  DAngle local_70;
  DVector3 pos;
  
  local_88 = 0;
  do {
    if (numsectors <= local_88) {
      return;
    }
    ppAVar10 = &sectors[local_88].thinglist;
    while( true ) {
      key = (AInventory *)*ppAVar10;
      if (key == (AInventory *)0x0) break;
      if ((0 < am_cheat.Value) || (((key->super_AActor).flags6.Value & 0x40000000) == 0)) {
        AActor::PosRelative(&pos,(AActor *)key,MapPortalGroup);
        y = pos.Y;
        dVar12 = pos.X;
        local_98 = pos.X;
        dStack_90 = pos.Y;
        if ((0 < am_showthingsprites.Value) && (0 < (key->super_AActor).sprite)) {
          uVar9 = 0;
          tex = (FTexture *)0x0;
          uVar5 = am_showthingsprites.Value;
          while ((psVar1 = SpriteFrames.Array, uVar5 != 0 && (tex == (FTexture *)0x0))) {
            if (uVar5 < 2) {
              uVar6 = 0;
            }
            else {
              uVar6 = (ulong)(key->super_AActor).frame;
            }
            uVar8 = (ulong)sprites.Array[(key->super_AActor).sprite].spriteframes;
            dVar11 = 270.0 - (key->super_AActor).Angles.Yaw.Degrees;
            if (SpriteFrames.Array[uVar6 + uVar8].Texture[0].texnum !=
                SpriteFrames.Array[uVar6 + uVar8].Texture[1].texnum) {
              dVar11 = dVar11 + 11.25;
            }
            if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
              pAVar7 = GC::ReadBarrier<AActor>
                                 ((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
              dVar11 = dVar11 + (pAVar7->Angles).Yaw.Degrees + -90.0;
            }
            unaff_RBP = psVar1 + uVar6 + uVar8;
            uVar9 = (uint)((double)((ulong)(dVar11 * 11930464.711111112 + 6755399441055744.0) &
                                   0xffffffff) * 8.381903171539307e-08 * 0.044444444444444446);
            uVar3 = 0;
            if (2 < uVar5) {
              uVar3 = uVar9;
            }
            tex = FTextureManager::operator()
                            (&TexMan,(FTextureID)unaff_RBP->Texture[(int)uVar3].texnum,false);
            uVar5 = uVar5 - 1;
          }
          if (tex != (FTexture *)0x0) {
            DrawMarker(tex,dVar12,y,0,(uint)((unaff_RBP->Flip >> (uVar9 & 0x1f) & 1) != 0),
                       (key->super_AActor).Scale.X * 0.625 * scale_mtof,
                       (key->super_AActor).Scale.Y * 0.625 * scale_mtof,
                       (key->super_AActor).Translation,1.0,0,LegacyRenderStyles[1]);
            goto LAB_00366cf3;
          }
        }
        dVar12 = (key->super_AActor).Angles.Yaw.Degrees;
        if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
          AM_rotatePoint(&local_98,&dStack_90);
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
          dVar12 = dVar12 + (90.0 - (pAVar7->Angles).Yaw.Degrees);
        }
        color = AMColors.c[7];
        uVar5 = (key->super_AActor).flags.Value;
        if (((uVar5 >> 0x14 & 1) == 0 & *(byte *)((long)&(key->super_AActor).flags3.Value + 1) >> 5)
            == 1) {
          color = AMColors.c[0xc];
          if (((uVar5 >> 0x1b & 1) == 0) && (color = AMColors.c[10], (uVar5 >> 0x16 & 1) == 0)) {
            color = AMColors.c[0xb];
          }
LAB_00366c66:
          if (color.Index != -1) {
            local_78.Degrees = dVar12;
            AM_drawLineCharacter(thintriangle_guy,3,16.0,&local_78,&color,local_98,dStack_90);
          }
        }
        else {
          if ((uVar5 & 1) == 0) goto LAB_00366c66;
          bVar2 = DObject::IsKindOf((DObject *)key,AKey::RegistrationInfo.MyClass);
          if (!bVar2) {
            color = AMColors.c[9];
            if (((key->super_AActor).flags.Value & 0x800000) == 0) {
LAB_00366c4c:
              color = AMColors.c[8];
            }
            goto LAB_00366c66;
          }
          iVar4 = G_SkillProperty(SKILLP_EasyKey);
          if (iVar4 == 0) {
            if (am_showkeys.Value != true) goto LAB_00366c4c;
            uVar5 = P_GetMapColorForKey(key);
            if ((int)uVar5 < 0) {
              color = AMColors.c[9];
            }
            else {
              AMColor::FromRGB(&color,uVar5 >> 0x10 & 0xff,uVar5 >> 8 & 0xff,uVar5 & 0xff);
            }
            local_70.Degrees = 0.0;
            AM_drawLineCharacter
                      (CheatKey.Array,CheatKey.Count,0.0,&local_70,&color,local_98,dStack_90);
          }
          color.Index = -1;
        }
        if ((am_cheat.Value == 6) || (am_cheat.Value == 3)) {
          local_80.Degrees = dVar12 - (key->super_AActor).Angles.Yaw.Degrees;
          AM_drawLineCharacter
                    (AM_drawThings::box,4,(key->super_AActor).radius,&local_80,&color,local_98,
                     dStack_90);
        }
      }
LAB_00366cf3:
      ppAVar10 = &(key->super_AActor).snext;
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void AM_drawThings ()
{
	AMColor color;
	int		 i;
	AActor*	 t;
	mpoint_t p;
	DAngle	 angle;

	for (i=0;i<numsectors;i++)
	{
		t = sectors[i].thinglist;
		while (t)
		{
			if (am_cheat > 0 || !(t->flags6 & MF6_NOTONAUTOMAP))
			{
				DVector3 pos = t->PosRelative(MapPortalGroup);
				p.x = pos.X;
				p.y = pos.Y;

				if (am_showthingsprites > 0 && t->sprite > 0)
				{
					FTexture *texture = NULL;
					spriteframe_t *frame;
					int rotation = 0;

					// try all modes backwards until a valid texture has been found.	
					for(int show = am_showthingsprites; show > 0 && texture == NULL; show--)
					{
						const spritedef_t& sprite = sprites[t->sprite];
						const size_t spriteIndex = sprite.spriteframes + (show > 1 ? t->frame : 0);

						frame = &SpriteFrames[spriteIndex];
						DAngle angle = 270. -t->Angles.Yaw;
						if (frame->Texture[0] != frame->Texture[1]) angle += 180. / 16;
						if (am_rotate == 1 || (am_rotate == 2 && viewactive))
						{
							angle += players[consoleplayer].camera->Angles.Yaw - 90.;
						}
						rotation = int((angle.Normalized360() * (16. / 360.)).Degrees);

						const FTextureID textureID = frame->Texture[show > 2 ? rotation : 0];
						texture = TexMan(textureID);
					}

					if (texture == NULL) goto drawTriangle;	// fall back to standard display if no sprite can be found.

					const double spriteXScale = (t->Scale.X * (10. / 16.) * scale_mtof);
					const double spriteYScale = (t->Scale.Y * (10. / 16.) * scale_mtof);

					DrawMarker (texture, p.x, p.y, 0, !!(frame->Flip & (1 << rotation)),
						spriteXScale, spriteYScale, t->Translation, 1., 0, LegacyRenderStyles[STYLE_Normal]);
				}
				else
				{
			drawTriangle:
					angle = t->Angles.Yaw;

					if (am_rotate == 1 || (am_rotate == 2 && viewactive))
					{
						AM_rotatePoint (&p.x, &p.y);
						angle += -players[consoleplayer].camera->Angles.Yaw + 90.;
					}

					color = AMColors[AMColors.ThingColor];

					// use separate colors for special thing types
					if (t->flags3&MF3_ISMONSTER && !(t->flags&MF_CORPSE))
					{
						if (t->flags & MF_FRIENDLY) color = AMColors[AMColors.ThingColor_Friend];
						else if (!(t->flags & MF_COUNTKILL)) color = AMColors[AMColors.ThingColor_NocountMonster];
						else color = AMColors[AMColors.ThingColor_Monster];
					}
					else if (t->flags&MF_SPECIAL)
					{
						// Find the key's own color.
						// Only works correctly if single-key locks have lower numbers than any-key locks.
						// That is the case for all default keys, however.
						if (t->IsKindOf(RUNTIME_CLASS(AKey)))
						{
							if (G_SkillProperty(SKILLP_EasyKey))
							{
								// Already drawn by AM_drawKeys(), so don't draw again
								color.Index = -1;
							}
							else if (am_showkeys)
							{
								int P_GetMapColorForKey (AInventory * key);
								int c = P_GetMapColorForKey(static_cast<AKey *>(t));

								if (c >= 0)	color.FromRGB(RPART(c), GPART(c), BPART(c));
								else color = AMColors[AMColors.ThingColor_CountItem];
								AM_drawLineCharacter(&CheatKey[0], CheatKey.Size(), 0, 0., color, p.x, p.y);
								color.Index = -1;
							}
							else
							{
								color = AMColors[AMColors.ThingColor_Item];
							}
						}
						else if (t->flags&MF_COUNTITEM)
							color = AMColors[AMColors.ThingColor_CountItem];
						else
							color = AMColors[AMColors.ThingColor_Item];
					}

					if (color.Index != -1)
					{
						AM_drawLineCharacter(thintriangle_guy, NUMTHINTRIANGLEGUYLINES,	16, angle, color, p.x, p.y);
					}

					if (am_cheat == 3 || am_cheat == 6)
					{
						static const mline_t box[4] =
						{
							{ { -1, -1 }, {  1, -1 } },
							{ {  1, -1 }, {  1,  1 } },
							{ {  1,  1 }, { -1,  1 } },
							{ { -1,  1 }, { -1, -1 } },
						};

						AM_drawLineCharacter (box, 4, t->radius, angle - t->Angles.Yaw, color, p.x, p.y);
					}
				}
			}
			t = t->snext;
		}
	}
}